

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  Mat *top_blob;
  Mat *bottom_blob1;
  Mat *bottom_blob;
  Option *in_stack_00001eb0;
  Mat *in_stack_00001eb8;
  Mat *in_stack_00001ec0;
  Mat *in_stack_00001ec8;
  Mat *in_stack_00001ed0;
  Mat *in_stack_00001ed8;
  undefined4 local_4;
  
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_4 = binary_op<ncnn::binary_op_add>
                        (in_stack_00001ed8,in_stack_00001ed0,in_stack_00001ec8,
                         (Option *)in_stack_00001ec0);
  }
  else if (*(int *)(in_RDI + 0xd0) == 1) {
    local_4 = binary_op<ncnn::binary_op_sub>
                        (in_stack_00001ec8,in_stack_00001ec0,in_stack_00001eb8,in_stack_00001eb0);
  }
  else if (*(int *)(in_RDI + 0xd0) == 2) {
    local_4 = binary_op<ncnn::binary_op_mul>
                        (in_stack_00001ec8,in_stack_00001ec0,in_stack_00001eb8,in_stack_00001eb0);
  }
  else if (*(int *)(in_RDI + 0xd0) == 3) {
    local_4 = binary_op<ncnn::binary_op_div>
                        (in_stack_00001ec8,in_stack_00001ec0,in_stack_00001eb8,in_stack_00001eb0);
  }
  else if (*(int *)(in_RDI + 0xd0) == 4) {
    local_4 = binary_op<ncnn::binary_op_max>
                        (in_stack_00001ec8,in_stack_00001ec0,in_stack_00001eb8,in_stack_00001eb0);
  }
  else if (*(int *)(in_RDI + 0xd0) == 5) {
    local_4 = binary_op<ncnn::binary_op_min>
                        (in_stack_00001ec8,in_stack_00001ec0,in_stack_00001eb8,in_stack_00001eb0);
  }
  else if (*(int *)(in_RDI + 0xd0) == 6) {
    local_4 = binary_op<ncnn::binary_op_pow>
                        (in_stack_00001ec8,in_stack_00001ec0,in_stack_00001eb8,in_stack_00001eb0);
  }
  else if (*(int *)(in_RDI + 0xd0) == 7) {
    local_4 = binary_op<ncnn::binary_op_sub>
                        (in_stack_00001ec8,in_stack_00001ec0,in_stack_00001eb8,in_stack_00001eb0);
  }
  else if (*(int *)(in_RDI + 0xd0) == 8) {
    local_4 = binary_op<ncnn::binary_op_div>
                        (in_stack_00001ec8,in_stack_00001ec0,in_stack_00001eb8,in_stack_00001eb0);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);

    return 0;
}